

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O1

char * chest_trap_name(object *obj)

{
  ushort uVar1;
  char *in_RAX;
  char *pcVar2;
  chest_trap *pcVar3;
  chest_trap *pcVar4;
  bool bVar5;
  
  uVar1 = obj->pval;
  if ((short)uVar1 < 0) {
    pcVar2 = "disarmed";
    if (uVar1 == 0xffff) {
      pcVar2 = "unlocked";
    }
    return pcVar2;
  }
  if (uVar1 != 0) {
    pcVar3 = (chest_trap *)0x0;
    if (chest_traps != (chest_trap *)0x0) {
      in_RAX = "multiple traps";
      pcVar4 = chest_traps;
      do {
        if (((pcVar4->pval & (uint)uVar1) != 0) &&
           (bVar5 = pcVar3 != (chest_trap *)0x0, pcVar3 = pcVar4, bVar5)) goto LAB_00188726;
        pcVar4 = pcVar4->next;
      } while (pcVar4 != (chest_trap *)0x0);
    }
    if (pcVar3 == (chest_trap *)0x0) {
      bVar5 = true;
    }
    else {
      in_RAX = pcVar3->name;
LAB_00188726:
      bVar5 = false;
    }
    if (!bVar5) {
      return in_RAX;
    }
  }
  return "empty";
}

Assistant:

const char *chest_trap_name(const struct object *obj)
{
	int16_t trap_value = obj->pval;

	/* Non-zero value means there either were or are still traps */
	if (trap_value < 0) {
		return (trap_value == -1) ? "unlocked" : "disarmed";
	} else if (trap_value > 0) {
		struct chest_trap *trap = chest_traps, *found = NULL;
		while (trap) {
			if (trap_value & trap->pval) {
				if (found) {
					return "multiple traps";
				}
				found = trap;
			}
			trap = trap->next;
		}
		if (found) {
			return found->name;
		}
	}

	return "empty";
}